

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

double __thiscall
vkt::shaderexecutor::Functions::Div::precision
          (Div *this,EvalContext *ctx,double ret,double param_3,double den)

{
  bool bVar1;
  int iVar2;
  float fVar3;
  double x;
  double a;
  double b;
  FloatFormat *fmt;
  double den_local;
  double param_3_local;
  double ret_local;
  EvalContext *ctx_local;
  Div *this_local;
  
  if ((den != 0.0) || (NAN(den))) {
    x = deAbs(den);
    iVar2 = tcu::FloatFormat::getMinExp(&ctx->format);
    a = deLdExp(1.0,iVar2);
    iVar2 = tcu::FloatFormat::getMaxExp(&ctx->format);
    b = deLdExp(1.0,iVar2 + -1);
    bVar1 = de::inBounds<double>(x,a,b);
    if (bVar1) {
      this_local = (Div *)tcu::FloatFormat::ulp(&ctx->format,ret,2.5);
    }
    else {
      fVar3 = std::numeric_limits<float>::infinity();
      this_local = (Div *)(double)fVar3;
    }
  }
  else {
    this_local = (Div *)0x0;
  }
  return (double)this_local;
}

Assistant:

double		precision		(const EvalContext& ctx, double ret, double, double den) const
	{
		const FloatFormat&	fmt		= ctx.format;

		// \todo [2014-03-05 lauri] Check that the limits in GLSL 3.10 are actually correct.
		// For now, we assume that division's precision is 2.5 ULP when the value is within
		// [2^MINEXP, 2^MAXEXP-1]

		if (den == 0.0)
			return 0.0; // Result must be exactly inf
		else if (de::inBounds(deAbs(den),
							  deLdExp(1.0, fmt.getMinExp()),
							  deLdExp(1.0, fmt.getMaxExp() - 1)))
			return fmt.ulp(ret, 2.5);
		else
			return TCU_INFINITY; // Can be any number, but must be a number.
	}